

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgs.c
# Opt level: O2

void trn_lbfgs(mdl_t *mdl)

{
  undefined8 uVar1;
  undefined8 uVar2;
  opt_t *poVar3;
  char *pcVar4;
  long lVar5;
  undefined8 uVar6;
  size_t sVar7;
  mdl_t *pmVar8;
  _Bool _Var9;
  int iVar10;
  uint64_t f_1;
  double *pdVar11;
  double *pdVar12;
  FILE *pFVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  double *pdVar16;
  undefined1 *puVar17;
  long lVar18;
  uint32_t m;
  uint uVar19;
  double dVar20;
  ulong uVar21;
  double *pdVar22;
  uint32_t m_1;
  double dVar23;
  uint64_t uVar24;
  uint64_t f_6;
  bool bVar25;
  double dVar26;
  double dVar27;
  undefined1 *puVar28;
  double dVar29;
  double *pdVar30;
  undefined8 uStack_130;
  double local_128;
  uint64_t nftr;
  double *local_118;
  ulong local_110;
  double *local_108;
  size_t local_100;
  ulong local_f8;
  undefined1 *local_f0;
  int local_e8;
  uint local_e4;
  int type;
  int histsz;
  uint64_t f;
  undefined1 *local_d0;
  double local_c8;
  uint32_t local_bc;
  uint local_b8;
  uint local_b4;
  long local_b0;
  double *local_a8;
  double *local_a0;
  double local_98;
  double *local_90;
  mdl_t *local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  long local_60;
  double *local_58;
  long local_50;
  uint64_t local_48;
  double *local_40;
  double *local_38;
  
  poVar3 = mdl->opt;
  uVar24 = mdl->nftr;
  local_bc = poVar3->maxiter;
  local_f8 = (ulong)poVar3->objwin;
  uVar19 = (poVar3->lbfgs).histsz;
  dVar23 = (double)(ulong)uVar19;
  local_68 = poVar3->rho1;
  local_110 = (long)dVar23 * 8 + 0xfU & 0xfffffffffffffff0;
  local_60 = (long)&local_128 - local_110;
  local_50 = local_60 - local_110;
  local_b0 = local_50 - local_110;
  puVar17 = (undefined1 *)(local_b0 - (local_f8 * 8 + 0xf & 0xfffffffffffffff0));
  pdVar22 = mdl->theta;
  local_f0 = puVar17;
  local_88 = mdl;
  *(undefined8 *)(puVar17 + -8) = 0x1098f4;
  pdVar11 = xvm_new(uVar24);
  *(undefined8 *)(puVar17 + -8) = 0x1098ff;
  local_58 = xvm_new(uVar24);
  *(undefined8 *)(puVar17 + -8) = 0x10990b;
  local_a8 = xvm_new(uVar24);
  *(undefined8 *)(puVar17 + -8) = 0x10991a;
  local_40 = xvm_new(uVar24);
  for (dVar20 = 0.0; dVar23 != dVar20; dVar20 = (double)((long)dVar20 + 1)) {
    *(undefined8 *)(puVar17 + -8) = 0x10992d;
    pdVar12 = xvm_new(uVar24);
    *(double **)(local_60 + (long)dVar20 * 8) = pdVar12;
    *(undefined8 *)(puVar17 + -8) = 0x10993d;
    pdVar12 = xvm_new(uVar24);
    *(double **)(local_50 + (long)dVar20 * 8) = pdVar12;
  }
  local_90 = pdVar11;
  if ((local_68 != 0.0) || (NAN(local_68))) {
    *(undefined8 *)(puVar17 + -8) = 0x10996a;
    local_a0 = xvm_new(uVar24);
  }
  else {
    local_a0 = (double *)0x0;
  }
  pdVar11 = local_58;
  pmVar8 = local_88;
  *(undefined8 *)(puVar17 + -8) = 0x10998e;
  f = (uint64_t)grd_new(pmVar8,pdVar11);
  pcVar4 = pmVar8->opt->rstate;
  local_78 = dVar23;
  local_48 = uVar24;
  if (pcVar4 != (char *)0x0) {
    *(undefined8 *)(puVar17 + -8) = 0x1099b9;
    pFVar13 = fopen(pcVar4,"r");
    if (pFVar13 == (FILE *)0x0) {
      *(undefined8 *)(puVar17 + -8) = 0x1099cf;
      fatal("failed to open input state file");
    }
    *(undefined8 *)(puVar17 + -8) = 0x1099f5;
    iVar10 = __isoc99_fscanf(pFVar13,"#state#%d#%d#%lu\n",&local_e8,&local_e4,&local_128);
    if (iVar10 != 3) {
      *(undefined8 *)(puVar17 + -8) = 0x109a0f;
      fatal("0 %s","invalid state file");
    }
    if ((local_e8 != 0) || (local_e4 != uVar19)) {
      *(undefined8 *)(puVar17 + -8) = 0x109a2f;
      fatal("state is not compatible");
    }
    dVar20 = 0.0;
    while (dVar23 = local_78, (ulong)dVar20 < (ulong)local_128) {
      local_38 = (double *)dVar20;
      *(undefined8 *)(puVar17 + -8) = 0x109a68;
      iVar10 = __isoc99_fscanf(pFVar13,"%lu",&type);
      if (iVar10 != 1) {
        *(undefined8 *)(puVar17 + -8) = 0x109a7e;
        fatal("1 %s","invalid state file");
      }
      pdVar11 = local_90 + _type;
      pdVar12 = local_a8 + _type;
      *(undefined8 *)(puVar17 + -8) = 0x109aac;
      iVar10 = __isoc99_fscanf(pFVar13,"%la %la",pdVar11,pdVar12);
      if (iVar10 != 2) {
        *(undefined8 *)(puVar17 + -8) = 0x109ac2;
        fatal("2 %s","invalid state file");
      }
      for (dVar23 = 0.0; local_78 != dVar23; dVar23 = (double)((long)dVar23 + 1)) {
        lVar18 = _type * 8;
        lVar5 = *(long *)(local_60 + (long)dVar23 * 8);
        *(undefined8 *)(puVar17 + -8) = 0x109aeb;
        iVar10 = __isoc99_fscanf(pFVar13,"%la",lVar18 + lVar5);
        if (iVar10 != 1) {
          *(undefined8 *)(puVar17 + -8) = 0x109b01;
          fatal("3 %s","invalid state file");
        }
        lVar18 = _type * 8;
        lVar5 = *(long *)(local_50 + (long)dVar23 * 8);
        *(undefined8 *)(puVar17 + -8) = 0x109b21;
        iVar10 = __isoc99_fscanf(pFVar13,"%la",lVar18 + lVar5);
        if (iVar10 != 1) {
          *(undefined8 *)(puVar17 + -8) = 0x109b37;
          fatal("4 %s","invalid state file");
        }
      }
      uVar24 = local_48;
      dVar20 = (double)((long)local_38 + 1);
    }
    for (dVar20 = 0.0; dVar23 != dVar20; dVar20 = (double)((long)dVar20 + 1)) {
      pdVar11 = *(double **)(local_50 + (long)dVar20 * 8);
      pdVar12 = *(double **)(local_60 + (long)dVar20 * 8);
      *(undefined8 *)(puVar17 + -8) = 0x109b6f;
      dVar26 = xvm_dot(pdVar11,pdVar12,uVar24);
      *(double *)(local_b0 + (long)dVar20 * 8) = 1.0 / dVar26;
    }
    *(undefined8 *)(puVar17 + -8) = 0x109b94;
    fclose(pFVar13);
  }
  uVar14 = f;
  *(undefined8 *)(puVar17 + -8) = 0x109ba0;
  local_c8 = grd_gradient((grd_t *)uVar14);
  local_b4 = SUB84(dVar23,0);
  local_100 = uVar24 * 8;
  dVar20 = 0.0;
  pdVar11 = local_90;
  local_108 = pdVar22;
  local_b8 = local_b4;
  do {
    pdVar30 = local_40;
    pdVar12 = local_58;
    local_b8 = local_b8 + 1;
    local_98 = dVar23;
    if ((ulong)dVar20 < (ulong)dVar23) {
      local_98 = dVar20;
    }
    local_80 = dVar20;
    if ((uit_stop != false) || (local_bc <= SUB84(dVar20,0))) goto LAB_0010a271;
    if ((local_68 != 0.0) || (pdVar16 = local_58, NAN(local_68))) {
      dVar20 = local_88->opt->rho1;
      for (uVar14 = 0; pdVar16 = local_a0, uVar24 != uVar14; uVar14 = uVar14 + 1) {
        if (0.0 <= pdVar22[uVar14]) {
          dVar26 = local_58[uVar14];
          dVar29 = dVar20 + dVar26;
          if (((pdVar22[uVar14] <= 0.0) && (-dVar20 <= dVar26)) && (dVar29 = 0.0, dVar20 < dVar26))
          {
            dVar29 = dVar26 - dVar20;
          }
        }
        else {
          dVar29 = local_58[uVar14] - dVar20;
        }
        local_a0[uVar14] = dVar29;
      }
    }
    local_118 = pdVar16;
    *(undefined8 *)(puVar17 + -8) = 0x109cad;
    xvm_neg(pdVar30,pdVar16,uVar24);
    if (local_80._0_4_ != 0) {
      uVar19 = local_b8 - SUB84(local_98,0);
      dVar26 = (double)((long)puVar17 - local_110);
      dVar20 = local_98;
      local_d0 = puVar17;
      local_38 = (double *)dVar26;
      while (pdVar22 = local_40, uVar24 = local_48, bVar25 = dVar20 != 0.0,
            dVar20 = (double)((long)dVar20 - 1), bVar25) {
        uVar21 = (ulong)uVar19 % ((ulong)dVar23 & 0xffffffff);
        local_70 = *(double *)(local_b0 + uVar21 * 8);
        pdVar11 = *(double **)(local_60 + uVar21 * 8);
        *(undefined8 *)((long)dVar26 - 8) = 0x109d1c;
        dVar29 = xvm_dot(pdVar11,pdVar22,uVar24);
        dVar23 = local_78;
        dVar29 = dVar29 * local_70;
        *(double *)((long)local_38 + (long)dVar20 * 8) = dVar29;
        pdVar11 = *(double **)(local_50 + uVar21 * 8);
        *(undefined8 *)((long)dVar26 - 8) = 0x109d4d;
        xvm_axpy(pdVar22,-dVar29,pdVar11,pdVar22,uVar24);
        uVar19 = uVar19 + 1;
      }
      uVar21 = ((ulong)local_80 & 0xffffffff) % ((ulong)dVar23 & 0xffffffff);
      pdVar22 = *(double **)(local_50 + uVar21 * 8);
      *(undefined8 *)((long)dVar26 - 8) = 0x109d73;
      dVar29 = xvm_dot(pdVar22,pdVar22,uVar24);
      dVar20 = *(double *)(local_b0 + uVar21 * 8);
      for (uVar14 = 0; uVar24 != uVar14; uVar14 = uVar14 + 1) {
        local_40[uVar14] = local_40[uVar14] * (1.0 / (dVar29 * dVar20));
      }
      pdVar22 = local_108;
      uVar19 = local_b4;
      for (dVar20 = 0.0; pdVar30 = local_40, uVar24 = local_48, pdVar12 = local_58,
          puVar17 = local_d0, pdVar11 = local_90, local_98 != dVar20;
          dVar20 = (double)((long)dVar20 + 1)) {
        uVar21 = (ulong)uVar19 % ((ulong)dVar23 & 0xffffffff);
        local_70 = *(double *)(local_b0 + uVar21 * 8);
        pdVar22 = *(double **)(local_50 + uVar21 * 8);
        *(undefined8 *)((long)dVar26 - 8) = 0x109df9;
        dVar27 = xvm_dot(pdVar22,pdVar30,uVar24);
        dVar23 = local_78;
        pdVar22 = local_108;
        dVar27 = dVar27 * local_70;
        dVar29 = *(double *)((long)local_38 + (long)dVar20 * 8);
        pdVar11 = *(double **)(local_60 + uVar21 * 8);
        *(undefined8 *)((long)dVar26 - 8) = 0x109e31;
        xvm_axpy(pdVar30,dVar29 - dVar27,pdVar11,pdVar30,uVar24);
        uVar19 = uVar19 - 1;
      }
    }
    sVar7 = local_100;
    if ((local_68 != 0.0) || (NAN(local_68))) {
      for (uVar14 = 0; uVar24 != uVar14; uVar14 = uVar14 + 1) {
        if (0.0 <= local_40[uVar14] * local_a0[uVar14]) {
          local_40[uVar14] = 0.0;
        }
      }
    }
    *(undefined8 *)(puVar17 + -8) = 0x109ea0;
    memcpy(pdVar11,pdVar22,sVar7);
    pdVar30 = local_a8;
    *(undefined8 *)(puVar17 + -8) = 0x109eb2;
    memcpy(pdVar30,pdVar12,sVar7);
    pdVar12 = local_40;
    uVar24 = local_48;
    pdVar30 = (double *)0x3ff0000000000000;
    bVar25 = local_80._0_4_ == 0;
    if (bVar25) {
      *(undefined8 *)(puVar17 + -8) = 0x109ed3;
      dVar20 = xvm_norm(pdVar12,uVar24);
      pdVar30 = (double *)(1.0 / dVar20);
    }
    pdVar16 = local_40;
    uVar24 = local_48;
    pdVar12 = local_58;
    puVar28 = (undefined1 *)0x0;
    if ((local_68 == 0.0) && (!NAN(local_68))) {
      local_38 = pdVar30;
      *(undefined8 *)(puVar17 + -8) = 0x109f06;
      puVar28 = (undefined1 *)xvm_dot(pdVar12,pdVar16,uVar24);
      pdVar30 = local_38;
    }
    dVar26 = local_c8;
    local_70 = *(double *)(&DAT_00111220 + (ulong)bVar25 * 8);
    local_d0 = puVar28;
    nftr = (uint64_t)((double)puVar28 * 0.9);
    *(undefined8 *)(puVar17 + -8) = 1;
    uVar24 = local_48;
    uVar21 = *(ulong *)(puVar17 + -8);
    while (pdVar12 = local_40, uit_stop == false) {
      local_38 = pdVar30;
      *(undefined8 *)(puVar17 + -8) = 0x109f75;
      xvm_axpy(pdVar22,(double)pdVar30,pdVar12,pdVar11,uVar24);
      uVar14 = f;
      if ((local_68 != 0.0) || (NAN(local_68))) {
        for (uVar15 = 0; uVar24 != uVar15; uVar15 = uVar15 + 1) {
          dVar20 = pdVar11[uVar15];
          if ((dVar20 == 0.0) && (!NAN(dVar20))) {
            dVar20 = -local_a0[uVar15];
          }
          if (dVar20 * pdVar22[uVar15] <= 0.0) {
            pdVar22[uVar15] = 0.0;
          }
        }
      }
      *(undefined8 *)(puVar17 + -8) = 0x109fd6;
      dVar26 = grd_gradient((grd_t *)uVar14);
      pdVar30 = local_40;
      pdVar12 = local_58;
      if ((local_68 != 0.0) || (NAN(local_68))) {
        dVar20 = 0.0;
        for (uVar14 = 0; uVar24 != uVar14; uVar14 = uVar14 + 1) {
          dVar20 = dVar20 + (pdVar22[uVar14] - pdVar11[uVar14]) * local_40[uVar14];
        }
        if (dVar26 < dVar20 * 0.0001 + local_c8) break;
      }
      else {
        local_70 = 0.5;
        if (dVar26 <= (double)local_d0 * (double)local_38 * 0.0001 + local_c8) {
          local_98 = dVar26;
          *(undefined8 *)(puVar17 + -8) = 0x10a081;
          dVar20 = xvm_dot(pdVar12,pdVar30,uVar24);
          local_70 = 2.1;
          dVar26 = local_98;
          if ((double)nftr <= dVar20) break;
        }
      }
      if ((uint32_t)uVar21 == (local_88->opt->lbfgs).maxls) {
        *(undefined8 *)(puVar17 + -8) = 0x10a25f;
        warning("maximum linesearch reached");
        goto LAB_0010a25f;
      }
      uVar21 = (ulong)((uint32_t)uVar21 + 1);
      pdVar30 = (double *)((double)local_38 * local_70);
    }
    pmVar8 = local_88;
    if (uit_stop == true) {
LAB_0010a25f:
      sVar7 = local_100;
      *(undefined8 *)(puVar17 + -8) = 0x10a271;
      memcpy(pdVar22,pdVar11,sVar7);
LAB_0010a271:
      pcVar4 = local_88->opt->sstate;
      if (pcVar4 != (char *)0x0) {
        *(undefined8 *)(puVar17 + -8) = 0x10a291;
        pFVar13 = fopen(pcVar4,"w");
        if (pFVar13 == (FILE *)0x0) {
          *(undefined8 *)(puVar17 + -8) = 0x10a2a7;
          fatal("failed to open output state file");
        }
        *(undefined8 *)(puVar17 + -8) = 0x10a2be;
        fprintf(pFVar13,"#state#0#%u#%lu\n",(ulong)dVar23 & 0xffffffff,uVar24);
        *(undefined8 *)(puVar17 + -8) = 10;
        uVar6 = *(undefined8 *)(puVar17 + -8);
        for (uVar14 = 0; uVar14 != uVar24; uVar14 = uVar14 + 1) {
          *(undefined8 *)(puVar17 + -8) = 0x10a2e9;
          fprintf(pFVar13,"%lu",uVar14);
          dVar23 = local_90[uVar14];
          dVar20 = local_a8[uVar14];
          *(undefined8 *)(puVar17 + -8) = 0x10a310;
          fprintf(pFVar13," %la %la",dVar23,dVar20);
          for (dVar23 = 0.0; local_78 != dVar23; dVar23 = (double)((long)dVar23 + 1)) {
            uVar1 = *(undefined8 *)(*(long *)(local_60 + (long)dVar23 * 8) + uVar14 * 8);
            uVar2 = *(undefined8 *)(*(long *)(local_50 + (long)dVar23 * 8) + uVar14 * 8);
            *(undefined8 *)(puVar17 + -8) = 0x10a342;
            fprintf(pFVar13," %la %la",uVar1,uVar2);
          }
          *(undefined8 *)(puVar17 + -8) = 0x10a352;
          fputc((int)uVar6,pFVar13);
          uVar24 = local_48;
        }
        *(undefined8 *)(puVar17 + -8) = 0x10a366;
        fclose(pFVar13);
        pdVar11 = local_90;
        dVar23 = local_78;
      }
      *(undefined8 *)(puVar17 + -8) = 0x10a379;
      xvm_free(pdVar11);
      pdVar22 = local_58;
      *(undefined8 *)(puVar17 + -8) = 0x10a382;
      xvm_free(pdVar22);
      pdVar22 = local_a8;
      *(undefined8 *)(puVar17 + -8) = 0x10a38e;
      xvm_free(pdVar22);
      pdVar22 = local_40;
      *(undefined8 *)(puVar17 + -8) = 0x10a397;
      xvm_free(pdVar22);
      for (dVar20 = 0.0; pdVar22 = local_a0, dVar23 != dVar20; dVar20 = (double)((long)dVar20 + 1))
      {
        pdVar22 = *(double **)(local_60 + (long)dVar20 * 8);
        *(undefined8 *)(puVar17 + -8) = 0x10a3ab;
        xvm_free(pdVar22);
        pdVar22 = *(double **)(local_50 + (long)dVar20 * 8);
        *(undefined8 *)(puVar17 + -8) = 0x10a3b8;
        xvm_free(pdVar22);
      }
      if ((local_68 != 0.0) || (NAN(local_68))) {
        *(undefined8 *)(puVar17 + -8) = 0x10a3da;
        xvm_free(pdVar22);
      }
      uVar24 = f;
      *(undefined8 *)(puVar17 + -8) = 0x10a3e6;
      grd_free((grd_t *)uVar24);
      return;
    }
    dVar20 = (double)((long)local_80 + 1);
    local_98 = dVar26;
    *(undefined8 *)(puVar17 + -8) = 0x10a0fa;
    _Var9 = uit_progress(pmVar8,SUB84(dVar20,0),dVar26);
    if (!_Var9) goto LAB_0010a271;
    uVar21 = ((ulong)dVar20 & 0xffffffff) % ((ulong)dVar23 & 0xffffffff);
    pdVar12 = *(double **)(local_60 + uVar21 * 8);
    local_38 = pdVar12;
    *(undefined8 *)(puVar17 + -8) = 0x10a126;
    xvm_sub(pdVar12,pdVar22,pdVar11,uVar24);
    pdVar30 = local_58;
    pdVar11 = local_a8;
    pdVar12 = *(double **)(local_50 + uVar21 * 8);
    *(undefined8 *)(puVar17 + -8) = 0x10a144;
    xvm_sub(pdVar12,pdVar30,pdVar11,uVar24);
    pdVar30 = local_38;
    pdVar11 = local_90;
    *(undefined8 *)(puVar17 + -8) = 0x10a15a;
    dVar26 = xvm_dot(pdVar12,pdVar30,uVar24);
    dVar23 = local_78;
    *(double *)(local_b0 + uVar21 * 8) = 1.0 / dVar26;
    *(undefined8 *)(puVar17 + -8) = 0x10a182;
    local_38 = (double *)xvm_norm(pdVar22,uVar24);
    pdVar12 = local_118;
    *(undefined8 *)(puVar17 + -8) = 0x10a196;
    dVar26 = xvm_norm(pdVar12,uVar24);
    pdVar12 = (double *)1.0;
    if (1.0 <= (double)local_38) {
      pdVar12 = local_38;
    }
    if (((dVar26 / (double)pdVar12 <= 1e-05) || (local_bc == SUB84(dVar20,0))) ||
       ((*(double *)(local_f0 + (((ulong)local_80 & 0xffffffff) % (local_f8 & 0xffffffff)) * 8) =
              local_98, (uint)local_f8 <= SUB84(local_80,0) &&
        (ABS(*(double *)(local_f0 + (((ulong)dVar20 & 0xffffffff) % (local_f8 & 0xffffffff)) * 8) -
             local_98) /
         *(double *)(local_f0 + (((ulong)dVar20 & 0xffffffff) % (local_f8 & 0xffffffff)) * 8) <
         local_88->opt->stopeps)))) goto LAB_0010a271;
    local_b4 = local_b4 + 1;
    local_c8 = local_98;
  } while( true );
}

Assistant:

void trn_lbfgs(mdl_t *mdl) {
	const uint64_t F  = mdl->nftr;
	const uint32_t K  = mdl->opt->maxiter;
	const uint32_t C  = mdl->opt->objwin;
	const uint32_t M  = mdl->opt->lbfgs.histsz;
	const bool     l1 = mdl->opt->rho1 != 0.0;
	double *x, *xp; // Current and previous value of the variables
	double *g, *gp; // Current and previous value of the gradient
	double *pg;     // The pseudo-gradient (only for owl-qn)
	double *d;      // The search direction
	double *s[M];   // History value s_k = Δ(x,px)
	double *y[M];   // History value y_k = Δ(g,pg)
	double  p[M];   // ρ_k
	double  fh[C];  // f(x) history
	// Initialization: Here, we have to allocate memory on the heap as we
	// cannot request so much memory on the stack as this will have a too
	// big impact on performance and will be refused by the system on non-
	// trivial models.
	x  = mdl->theta;
	xp = xvm_new(F); g = xvm_new(F);
	gp = xvm_new(F); d = xvm_new(F);
	for (uint32_t m = 0; m < M; m++) {
		s[m] = xvm_new(F);
		y[m] = xvm_new(F);
	}
	pg = l1 ? xvm_new(F) : NULL;
	grd_t *grd = grd_new(mdl, g);
	// Restore a saved state if user specified one.
	if (mdl->opt->rstate != NULL) {
		const char *err = "invalid state file";
		FILE *file = fopen(mdl->opt->rstate, "r");
		if (file == NULL)
			fatal("failed to open input state file");
		int type, histsz;
		uint64_t nftr;
		if (fscanf(file, "#state#%d#%d#%"SCNu64"\n", &type, &histsz,
				&nftr) != 3)
			fatal("0 %s", err);
		if (type != 0 || histsz != (int)M)
			fatal("state is not compatible");
		for (uint64_t i = 0; i < nftr; i++) {
			uint64_t f;
			if (fscanf(file, "%"PRIu64, &f) != 1)
				fatal("1 %s", err);
			if (fscanf(file, "%la %la", &xp[f], &gp[f]) != 2)
				fatal("2 %s", err);
			for (uint32_t m = 0; m < M; m++) {
				if (fscanf(file, "%la", &s[m][f]) != 1)
					fatal("3 %s", err);
				if (fscanf(file, "%la", &y[m][f]) != 1)
					fatal("4 %s", err);
			}
		}
		for (uint32_t m = 0; m < M; m++)
			p[m] = 1.0 / xvm_dot(y[m], s[m], F);
		fclose(file);
	}
	// Minimization: This is the heart of the function. (a big heart...) We
	// will perform iterations until one these conditions is reached
	//   - the maximum iteration count is reached
	//   - we have converged (upto numerical precision)
	//   - the report function return false
	//   - an error happen somewhere
	double fx = grd_gradient(grd);
	for (uint32_t k = 0; !uit_stop && k < K; k++) {
		// We first compute the pseudo-gradient of f for owl-qn. It is
		// defined in [3, pp 335(4)]
		//              | ∂_i^- f(x)   if ∂_i^- f(x) > 0
		//   ◇_i f(x) = | ∂_i^+ f(x)   if ∂_i^+ f(x) < 0
		//              | 0            otherwise
		// with
		//   ∂_i^± f(x) = ∂/∂x_i l(x) + | Cσ(x_i) if x_i ≠ 0
		//                              | ±C      if x_i = 0
		if (l1) {
			const double rho1 = mdl->opt->rho1;
			for (uint64_t f = 0; f < F; f++) {
				if (x[f] < 0.0)
					pg[f] = g[f] - rho1;
				else if (x[f] > 0.0)
					pg[f] = g[f] + rho1;
				else if (g[f] < -rho1)
					pg[f] = g[f] + rho1;
				else if (g[f] > rho1)
					pg[f] = g[f] - rho1;
				else
					pg[f] = 0.0;
			}
		}
		// 1st step: We compute the search direction. We search in the
		// direction who minimize the second order approximation given
		// by the Taylor series which give
		//   d_k = - H_k^{-1} g_k
		// But computing the inverse of the hessian is intractable so
		// the l-bfgs only approximate it's diagonal. The exact
		// computation is well described in [1, pp 779].
		// The only special thing for owl-qn here is to use the pseudo
		// gradient instead of the true one.
		xvm_neg(d, l1 ? pg : g, F);
		if (k != 0) {
			const uint32_t km = k % M;
			const uint32_t bnd = (k <= M) ? k : M;
			double alpha[M], beta;
			// α_i = ρ_j s_j^T q_{i+1}
			// q_i = q_{i+1} - α_i y_i
			for (uint32_t i = bnd; i > 0; i--) {
				const uint32_t j = (M + 1 + k - i) % M;
				alpha[i - 1] = p[j] * xvm_dot(s[j], d, F);
				xvm_axpy(d, -alpha[i - 1], y[j], d, F);
			}
			// r_0 = H_0 q_0
			//     Scaling is described in [2, pp 515]
			//     for k = 0: H_0 = I
			//     for k > 0: H_0 = I * y_k^T s_k / ||y_k||²
			//                    = I * 1 / ρ_k ||y_k||²
			const double y2 = xvm_dot(y[km], y[km], F);
			const double v = 1.0 / (p[km] * y2);
			for (uint64_t f = 0; f < F; f++)
				d[f] *= v;
			// β_j     = ρ_j y_j^T r_i
			// r_{i+1} = r_i + s_j (α_i - β_i)
			for (uint32_t i = 0; i < bnd; i++) {
				const uint32_t j = (M + k - i) % M;
				beta = p[j] * xvm_dot(y[j], d, F);
				xvm_axpy(d, alpha[i] - beta, s[j], d, F);
			}
		}
		// For owl-qn, we must remain in the same orthant than the
		// pseudo-gradient, so we have to constrain the search
		// direction as described in [3, pp 35(3)]
		//   d^k = π(d^k ; v^k)
		//       = π(d^k ; -◇f(x^k))
		if (l1)
			for (uint64_t f = 0; f < F; f++)
				if (d[f] * pg[f] >= 0.0)
					d[f] = 0.0;
		// 2nd step: we perform a linesearch in the computed direction,
		// we search a step value that satisfy the constrains using a
		// backtracking algorithm. Much elaborated algorithm can perform
		// better in the general case, but for CRF training, bactracking
		// is very efficient and simple to implement.
		// For quasi-Newton, the natural step is 1.0 so we start with
		// this one and reduce it only if it fail with an exception for
		// the first step where a better guess can be done.
		// We have to keep track of the current point and gradient as we
		// will need to compute the delta between those and the found
		// point, and perhaps need to restore them if linesearch fail.
		memcpy(xp, x, sizeof(double) * F);
		memcpy(gp, g, sizeof(double) * F);
		double sc  = (k == 0) ? 0.1 : 0.5;
		double stp = (k == 0) ? 1.0 / xvm_norm(d, F) : 1.0;
		double gd  = l1 ? 0.0 : xvm_dot(g, d, F); // gd = g_k^T d_k
		double fi  = fx;
		bool err = false;
		for (uint32_t ls = 1; !uit_stop; ls++, stp *= sc) {
			// We compute the new point using the current step and
			// search direction
			xvm_axpy(x, stp, d, xp, F);
			// For owl-qn, we have to project back the point in the
			// current orthant [3, pp 35]
			//   x^{k+1} = π(x^k + αp^k ; ξ)
			if (l1) {
				for (uint64_t f = 0; f < F; f++) {
					double or = xp[f];
					if (or == 0.0)
						or = -pg[f];
					if (x[f] * or <= 0.0)
						x[f] = 0.0;
				}
			}
			// And we ask for the value of the objective function
			// and its gradient.
			fx = grd_gradient(grd);
			// Now we check if the step satisfy the conditions. For
			// l-bfgs, we check the classical decrease and curvature
			// known as the Wolfe conditions [2, pp 506]
			//   f(x_k + α_k d_k) ≤ f(x_k) + β' α_k g_k^T d_k
			//   g(x_k + α_k d_k)^T d_k ≥ β g_k^T d_k
			//
			// And for owl-qn we check a variant of the Armijo rule
			// described in [3, pp 36]
			//   f(π(x^k+αp^k;ξ)) ≤ f(x^k) - γv^T[π(x^k+αp^k;ξ)-x^k]
			if (!l1) {
				if (fx > fi + stp * gd * 1e-4)
					sc = 0.5;
				else if (xvm_dot(g, d, F) < gd * 0.9)
					sc = 2.1;
				else
					break;
			} else {
				double vp = 0.0;
				for (uint64_t f = 0; f < F; f++)
					vp += (x[f] - xp[f]) * d[f];
				if (fx < fi + vp * 1e-4)
					break;
			}
			// If we reach the maximum number of linesearsh steps
			// without finding a good one, we just fail.
			if (ls == mdl->opt->lbfgs.maxls) {
				warning("maximum linesearch reached");
				err = true;
				break;
			}
		}
		// If linesearch failed or user interupted training, we return
		// to the last valid point and stop the training. The model is
		// probably not fully optimized but we let the user decide what
		// to do with it.
		if (err || uit_stop) {
			memcpy(x, xp, sizeof(double) * F);
			break;
		}
		if (uit_progress(mdl, k + 1, fx) == false)
			break;
		// 3rd step: we update the history used for approximating the
		// inverse of the diagonal of the hessian
		//   s_k = x_{k+1} - x_k
		//   y_k = g_{k+1} - g_k
		//   ρ_k = 1 / y_k^T s_k
		const uint32_t kn = (k + 1) % M;
		xvm_sub(s[kn], x, xp, F);
		xvm_sub(y[kn], g, gp, F);
		p[kn] = 1.0 / xvm_dot(y[kn], s[kn], F);
		// And last, we check for convergence. The convergence check is
		// quite simple [2, pp 508]
		//   ||g|| / max(1, ||x||) ≤ ε
		// with ε small enough so we stop when numerical precision is
		// reached. For owl-qn we just have to check against the pseudo-
		// gradient instead of the true one.
		const double xn = xvm_norm(x, F);
		const double gn = xvm_norm(l1 ? pg : g, F);
		if (gn / max(xn, 1.0) <= 1e-5)
			break;
		if (k + 1 == K)
			break;
		// Second stoping criterion tested is a check for improvement of
		// the function value over the past W iteration. When this come
		// under an epsilon, we also stop the minimization.
		fh[k % C] = fx;
		double dlt = 1.0;
		if (k >= C) {
			const double of = fh[(k + 1) % C];
			dlt = fabs(of - fx) / of;
			if (dlt < mdl->opt->stopeps)
				break;
		}
	}
	// Save the optimizer state if requested by the user
	if (mdl->opt->sstate != NULL) {
		FILE *file = fopen(mdl->opt->sstate, "w");
		if (file == NULL)
			fatal("failed to open output state file");
		fprintf(file, "#state#0#%"PRIu32"#%"PRIu64"\n", M, F);
		for (uint64_t f = 0; f < F; f++) {
			fprintf(file, "%"PRIu64, f);
			fprintf(file, " %la %la", xp[f], gp[f]);
			for (uint32_t m = 0; m < M; m++)
				fprintf(file, " %la %la", s[m][f], y[m][f]);
			fprintf(file, "\n");
		}
		fclose(file);
	}
	// Cleanup: We free all the vectors we have allocated.
	xvm_free(xp); xvm_free(g);
	xvm_free(gp); xvm_free(d);
	for (uint32_t m = 0; m < M; m++) {
		xvm_free(s[m]);
		xvm_free(y[m]);
	}
	if (l1)
		xvm_free(pg);
	grd_free(grd);
}